

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O1

bool __thiscall pfederc::Parser::skipToStmtEol(Parser *this)

{
  bool bVar1;
  Lexer *pLVar2;
  
  pLVar2 = this->lexer;
  while( true ) {
    bVar1 = Token::operator!=(pLVar2->currentToken,TOK_EOL);
    if (!bVar1) break;
    bVar1 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
    if (!bVar1) break;
    bVar1 = Token::operator!=(this->lexer->currentToken,TOK_STMT);
    if (!bVar1) break;
    Lexer::next(this->lexer);
    pLVar2 = this->lexer;
  }
  bVar1 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
  return bVar1;
}

Assistant:

bool Parser::skipToStmtEol() noexcept {
  while (*lexer.getCurrentToken() != TokenType::TOK_EOL
      && *lexer.getCurrentToken() != TokenType::TOK_EOF
      && *lexer.getCurrentToken() != TokenType::TOK_STMT)
    lexer.next();

  return *lexer.getCurrentToken() != TokenType::TOK_EOF;
}